

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_hashmap_walk(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  undefined8 *puVar1;
  int iVar2;
  sxi32 sVar3;
  jx9_value *pjVar4;
  jx9_value *local_98;
  uint local_90;
  sxu32 n;
  sxi32 rc;
  jx9_hashmap *pMap;
  jx9_hashmap_node *pEntry;
  jx9_value sKey;
  jx9_value *pUserData;
  jx9_value *pValue;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((nArg < 2) || (iVar2 = jx9_value_is_json_array(*apArg), iVar2 == 0)) {
    jx9_result_bool(pCtx,0);
  }
  else {
    if (nArg < 3) {
      local_98 = (jx9_value *)0x0;
    }
    else {
      local_98 = apArg[2];
    }
    sKey._56_8_ = local_98;
    puVar1 = (undefined8 *)((*apArg)->x).pOther;
    jx9MemObjInit((jx9_vm *)*puVar1,(jx9_value *)&pEntry);
    pMap = (jx9_hashmap *)puVar1[2];
    for (local_90 = 0; local_90 < *(uint *)((long)puVar1 + 0x2c); local_90 = local_90 + 1) {
      pjVar4 = HashmapExtractNodeValue((jx9_hashmap_node *)pMap);
      if (pjVar4 != (jx9_value *)0x0) {
        jx9HashmapExtractNodeKey((jx9_hashmap_node *)pMap,(jx9_value *)&pEntry);
        sVar3 = jx9VmCallUserFunctionAp
                          ((jx9_vm *)*puVar1,apArg[1],(jx9_value *)0x0,pjVar4,&pEntry,sKey._56_8_,0)
        ;
        jx9MemObjRelease((jx9_value *)&pEntry);
        if (sVar3 != 0) {
          jx9_result_bool(pCtx,0);
          return 0;
        }
      }
      pMap = (jx9_hashmap *)pMap->iNextIdx;
    }
    jx9_result_bool(pCtx,1);
  }
  return 0;
}

Assistant:

static int jx9_hashmap_walk(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pValue, *pUserData, sKey;
	jx9_hashmap_node *pEntry;
	jx9_hashmap *pMap;
	sxi32 rc;
	sxu32 n;
	if( nArg < 2 || !jx9_value_is_json_array(apArg[0]) ){
		/* Invalid/Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	pUserData = nArg > 2 ? apArg[2] : 0;
	/* Point to the internal representation of the input hashmap */
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	jx9MemObjInit(pMap->pVm, &sKey);
	/* Perform the desired operation */
	pEntry = pMap->pFirst;
	for( n = 0 ; n < pMap->nEntry ; n++ ){
		/* Extract the node value */
		pValue = HashmapExtractNodeValue(pEntry);
		if( pValue ){
			/* Extract the entry key */
			jx9HashmapExtractNodeKey(pEntry, &sKey);
			/* Invoke the supplied callback */
			rc = jx9VmCallUserFunctionAp(pMap->pVm, apArg[1], 0, pValue, &sKey, pUserData, 0);
			jx9MemObjRelease(&sKey);
			if( rc != SXRET_OK ){
				/* An error occured while invoking the supplied callback [i.e: not defined] */
				jx9_result_bool(pCtx, 0); /* return FALSE */
				return JX9_OK;
			}
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
	}
	/* All done, return TRUE */
	jx9_result_bool(pCtx, 1);
	return JX9_OK;
}